

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

uint8_t constant_time_select_8(crypto_word_t mask,uint8_t a,uint8_t b)

{
  crypto_word_t cVar1;
  uint8_t m;
  uint8_t b_local;
  uint8_t a_local;
  crypto_word_t mask_local;
  
  cVar1 = value_barrier_w(mask);
  return (byte)cVar1 & a | ((byte)cVar1 ^ 0xff) & b;
}

Assistant:

static inline uint8_t constant_time_select_8(crypto_word_t mask, uint8_t a,
                                             uint8_t b) {
  // |mask| is a word instead of |uint8_t| to avoid materializing 0x000..0MM
  // Making both |mask| and its value barrier |uint8_t| would allow the compiler
  // to materialize 0x????..?MM instead, but only clang is that clever.
  // However, vectorization of bitwise operations seems to work better on
  // |uint8_t| than a mix of |uint64_t| and |uint8_t|, so |m| is cast to
  // |uint8_t| after the value barrier but before the bitwise operations.
  uint8_t m = value_barrier_w(mask);
  return (m & a) | (~m & b);
}